

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O2

void __thiscall
Diligent::DescriptorSetAllocator::FreeDescriptorSet
          (DescriptorSetAllocator *this,VkDescriptorSet Set,VkDescriptorPool Pool,Uint64 QueueMask)

{
  RenderDeviceVkImpl *pRVar1;
  CommandQueue *pCVar2;
  ulong uVar3;
  VkDescriptorPool Args_1;
  _func_int **pp_Var4;
  ulong uVar5;
  string msg;
  DescriptorSetDeleter local_58;
  VkDescriptorPool local_40;
  DynamicStaleResourceWrapper Wrapper;
  
  pRVar1 = (this->super_DescriptorPoolManager).m_DeviceVkImpl;
  local_58.Allocator = this;
  local_58.Set = Set;
  local_58.Pool = Pool;
  local_40 = Pool;
  if ((pRVar1->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).m_CommandQueues == (CommandQueue *)0x0) {
    FormatString<char[99]>
              (&msg,(char (*) [99])
                    "Command queues have been destroyed. Are you releasing an object from the render device destructor?"
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SafeReleaseDeviceObject",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x6b);
    std::__cxx11::string::~string((string *)&msg);
  }
  uVar3 = (pRVar1->
          super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ).m_CmdQueueCount;
  uVar5 = ~(-1L << ((byte)uVar3 & 0x3f));
  if (0x3f < uVar3) {
    uVar5 = 0xffffffffffffffff;
  }
  uVar5 = uVar5 & QueueMask;
  if (uVar5 == 0) {
    FormatString<char[57]>
              (&msg,(char (*) [57])"At least one bit should be set in the command queue mask");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SafeReleaseDeviceObject",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x6f);
    std::__cxx11::string::~string((string *)&msg);
  }
  else {
    uVar3 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
    uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
    pp_Var4 = (_func_int **)(((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
    ;
    if (pp_Var4 == (_func_int **)0x1) {
      Wrapper.m_pStaleResource = (StaleResourceBase *)::operator_new(0x20);
      (Wrapper.m_pStaleResource)->_vptr_StaleResourceBase =
           (_func_int **)&PTR__SpecificStaleResource_00892440;
      Wrapper.m_pStaleResource[1]._vptr_StaleResourceBase = (_func_int **)this;
      Wrapper.m_pStaleResource[2]._vptr_StaleResourceBase = (_func_int **)Set;
      Wrapper.m_pStaleResource[3]._vptr_StaleResourceBase = (_func_int **)local_40;
    }
    else {
      Wrapper.m_pStaleResource = (StaleResourceBase *)::operator_new(0x28);
      (Wrapper.m_pStaleResource)->_vptr_StaleResourceBase =
           (_func_int **)&PTR__SpecificSharedStaleResource_00892480;
      Wrapper.m_pStaleResource[1]._vptr_StaleResourceBase = (_func_int **)this;
      Wrapper.m_pStaleResource[2]._vptr_StaleResourceBase = (_func_int **)Set;
      Wrapper.m_pStaleResource[3]._vptr_StaleResourceBase = (_func_int **)local_40;
      Wrapper.m_pStaleResource[4]._vptr_StaleResourceBase = pp_Var4;
    }
    local_58.Pool = (VkDescriptorPool)0x0;
    local_58.Set = (VkDescriptorSet)0x0;
    local_58.Allocator = (DescriptorSetAllocator *)0x0;
    Args_1 = local_40;
    for (; uVar5 != 0; uVar5 = uVar5 & ~(1L << (uVar3 & 0x3f))) {
      uVar3 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      if ((pRVar1->
          super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ).m_CmdQueueCount <= uVar3) {
        FormatString<char[26],char[27]>
                  (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x5b55cc,
                   (char (*) [27])Args_1);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"SafeReleaseDeviceObject",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
                   ,0x7a);
        std::__cxx11::string::~string((string *)&msg);
      }
      pCVar2 = (pRVar1->
               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
               ).m_CommandQueues;
      Args_1 = (VkDescriptorPool)(uVar3 * 0x168);
      ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::SafeReleaseResource
                ((ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *)
                 (Args_1 + (long)&pCVar2->ReleaseQueue),&Wrapper,
                 *(Uint64 *)(Args_1 + (long)&pCVar2->NextCmdBufferNumber));
      pp_Var4 = (_func_int **)((long)pp_Var4 - 1);
    }
    if (pp_Var4 != (_func_int **)0x0) {
      FormatString<char[26],char[19]>
                (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"NumReferences == 0",
                 (char (*) [19])Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SafeReleaseDeviceObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
                 ,0x82);
      std::__cxx11::string::~string((string *)&msg);
    }
    Wrapper.m_pStaleResource = (StaleResourceBase *)0x0;
    DynamicStaleResourceWrapper::~DynamicStaleResourceWrapper(&Wrapper);
  }
  FreeDescriptorSet::DescriptorSetDeleter::~DescriptorSetDeleter(&local_58);
  return;
}

Assistant:

void DescriptorSetAllocator::FreeDescriptorSet(VkDescriptorSet Set, VkDescriptorPool Pool, Uint64 QueueMask)
{
    class DescriptorSetDeleter
    {
    public:
        // clang-format off
        DescriptorSetDeleter(DescriptorSetAllocator& _Allocator,
                             VkDescriptorSet         _Set,
                             VkDescriptorPool        _Pool) :
            Allocator {&_Allocator},
            Set       {_Set       },
            Pool      {_Pool      }
        {}

        DescriptorSetDeleter             (const DescriptorSetDeleter&) = delete;
        DescriptorSetDeleter& operator = (const DescriptorSetDeleter&) = delete;
        DescriptorSetDeleter& operator = (      DescriptorSetDeleter&&)= delete;

        DescriptorSetDeleter(DescriptorSetDeleter&& rhs)noexcept :
            Allocator {rhs.Allocator},
            Set       {rhs.Set      },
            Pool      {rhs.Pool     }
        {
            rhs.Allocator = nullptr;
            rhs.Set       = VK_NULL_HANDLE;
            rhs.Pool      = VK_NULL_HANDLE;
        }
        // clang-format on

        ~DescriptorSetDeleter()
        {
            if (Allocator != nullptr)
            {
                std::lock_guard<std::mutex> Lock{Allocator->m_Mutex};
                Allocator->m_DeviceVkImpl.GetLogicalDevice().FreeDescriptorSet(Pool, Set);
#ifdef DILIGENT_DEVELOPMENT
                --Allocator->m_AllocatedSetCounter;
#endif
            }
        }

    private:
        DescriptorSetAllocator* Allocator;
        VkDescriptorSet         Set;
        VkDescriptorPool        Pool;
    };
    m_DeviceVkImpl.SafeReleaseDeviceObject(DescriptorSetDeleter{*this, Set, Pool}, QueueMask);
}